

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function2.hpp
# Opt level: O0

void fu2::abi_400::detail::type_erasure::tables::
     vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
     ::empty_cmd(vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
                 *to_table,opcode op,data_accessor *param_3,size_t param_4,data_accessor *to,
                size_t param_6)

{
  uint in_ESI;
  data_accessor *in_R8;
  vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
  *in_R9;
  
  if (in_ESI < 2) {
    set_empty(in_R9);
  }
  else if (1 < in_ESI - 2) {
    write_empty(in_R8,true);
  }
  return;
}

Assistant:

static void empty_cmd(vtable* to_table, opcode op, data_accessor* /*from*/,
                        std::size_t /*from_capacity*/, data_accessor* to,
                        std::size_t /*to_capacity*/) {

    switch (op) {
      case opcode::op_move:
      case opcode::op_copy: {
        to_table->set_empty();
        break;
      }
      case opcode::op_destroy:
      case opcode::op_weak_destroy: {
        // Do nothing
        break;
      }
      case opcode::op_fetch_empty: {
        write_empty(to, true);
        break;
      }
      default: {
        FU2_DETAIL_UNREACHABLE();
      }
    }
  }